

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  allocator local_81;
  string import_file;
  LocationRecorder weak_location;
  LocationRecorder location;
  
  LocationRecorder::LocationRecorder
            (&location,root_location,3,(dependency->super_RepeatedPtrFieldBase).current_size_);
  bVar2 = Consume(this,"import");
  if (!bVar2) {
LAB_00320b9f:
    bVar2 = false;
    goto LAB_00320ba1;
  }
  bVar2 = LookingAt(this,"public");
  if (bVar2) {
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)&import_file,root_location,10,public_dependency->current_size_);
    bVar2 = Consume(this,"public");
    if (!bVar2) {
      psVar5 = &import_file;
LAB_00320b9a:
      LocationRecorder::~LocationRecorder((LocationRecorder *)psVar5);
      goto LAB_00320b9f;
    }
    iVar1 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    piVar3 = RepeatedField<int>::Add(public_dependency);
    *piVar3 = iVar1;
    psVar5 = &import_file;
LAB_00320b13:
    LocationRecorder::~LocationRecorder((LocationRecorder *)psVar5);
  }
  else {
    bVar2 = LookingAt(this,"weak");
    if (bVar2) {
      LocationRecorder::LocationRecorder
                (&weak_location,root_location,0xb,weak_dependency->current_size_);
      std::__cxx11::string::string((string *)&import_file,"weak",&local_81);
      LocationRecorder::RecordLegacyImportLocation
                (&weak_location,&containing_file->super_Message,&import_file);
      std::__cxx11::string::~string((string *)&import_file);
      bVar2 = Consume(this,"weak");
      if (!bVar2) {
        psVar5 = (string *)&weak_location;
        goto LAB_00320b9a;
      }
      iVar1 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      piVar3 = RepeatedField<int>::Add(weak_dependency);
      *piVar3 = iVar1;
      psVar5 = (string *)&weak_location;
      goto LAB_00320b13;
    }
  }
  import_file._M_dataplus._M_p = (pointer)&import_file.field_2;
  import_file._M_string_length = 0;
  import_file.field_2._M_local_buf[0] = '\0';
  bVar2 = ConsumeString(this,&import_file,"Expected a string naming the file to import.");
  if (bVar2) {
    pbVar4 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(dependency);
    std::__cxx11::string::_M_assign((string *)pbVar4);
    LocationRecorder::RecordLegacyImportLocation
              (&location,&containing_file->super_Message,&import_file);
    bVar2 = ConsumeEndOfDeclaration(this,";",&location);
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&import_file);
LAB_00320ba1:
  LocationRecorder::~LocationRecorder(&location);
  return bVar2;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<std::string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  LocationRecorder location(root_location,
                            FileDescriptorProto::kDependencyFieldNumber,
                            dependency->size());

  DO(Consume("import"));

  if (LookingAt("public")) {
    LocationRecorder public_location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder weak_location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    weak_location.RecordLegacyImportLocation(containing_file, "weak");
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }

  string import_file;
  DO(ConsumeString(&import_file,
                   "Expected a string naming the file to import."));
  *dependency->Add() = import_file;
  location.RecordLegacyImportLocation(containing_file, import_file);

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}